

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
to<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
        string *utf8)

{
  byte bVar1;
  pointer pcVar2;
  uint uVar3;
  ostream *poVar4;
  runtime_error *this;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ostringstream ss;
  string local_1c8;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar6 = 0;
  do {
    uVar9 = (ulong)uVar6;
    if (utf8->_M_string_length <= uVar9) {
      return __return_storage_ptr__;
    }
    uVar7 = uVar6 + 1;
    pcVar2 = (utf8->_M_dataplus)._M_p;
    bVar1 = pcVar2[uVar9];
    uVar3 = uVar7;
    if (0xca < (byte)(bVar1 + 0xb)) {
      uVar8 = (uint)bVar1;
      if (bVar1 < 0xe0) {
        uVar8 = uVar8 & 0x1f;
      }
      else {
        if (bVar1 < 0xf0) {
          uVar8 = uVar8 & 0xf;
        }
        else {
          uVar5 = (ulong)uVar7;
          uVar7 = uVar6 + 2;
          uVar8 = (byte)pcVar2[uVar5] & 0x3f | (uVar8 & 7) << 6;
        }
        uVar5 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        uVar8 = (byte)pcVar2[uVar5] & 0x3f | uVar8 << 6;
      }
      uVar3 = uVar7 + 1;
      if (3 < uVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Can\'t convert codepoint U",0x19);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
        pcVar2 = (utf8->_M_dataplus)._M_p;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_1c8,pcVar2 + uVar9,pcVar2 + (uVar7 + 1));
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") to Latin1",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        this = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::stringbuf::str();
        booster::runtime_error::runtime_error(this,&local_1c8);
        __cxa_throw(this,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    uVar6 = uVar3;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  } while( true );
}

Assistant:

std::basic_string<Char> to(std::string const &utf8)
{
    std::basic_string<Char> out;
    unsigned i=0;
    while(i<utf8.size()) {
        unsigned point;
        unsigned prev=i;
        point = utf8_next(utf8,i);
        if(sizeof(Char)==1 && point > 255) {
            std::ostringstream ss;
            ss << "Can't convert codepoint U" << std::hex << point <<"(" <<std::string(utf8.begin()+prev,utf8.begin()+i)<<") to Latin1";
            throw booster::runtime_error(ss.str());
        }
        else if(sizeof(Char)==2 && point >0xFFFF) { // Deal with surragates
            point-=0x10000;
            out+=static_cast<Char>(0xD800 | (point>>10));
            out+=static_cast<Char>(0xDC00 | (point & 0x3FF));
            continue;
        }
        out+=static_cast<Char>(point);
    }
    return out;
}